

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

char * Json::duplicateStringValue(char *value,size_t length)

{
  char *__dest;
  undefined8 extraout_RAX;
  size_t __n;
  allocator local_39;
  string local_38;
  
  __n = 0x7ffffffe;
  if (length < 0x7ffffffe) {
    __n = length;
  }
  __dest = (char *)malloc(__n + 1);
  if (__dest != (char *)0x0) {
    memcpy(__dest,value,__n);
    __dest[__n] = '\0';
    return __dest;
  }
  std::__cxx11::string::string
            ((string *)&local_38,
             "in Json::Value::duplicateStringValue(): Failed to allocate string value buffer",
             &local_39);
  throwRuntimeError(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

static inline char* duplicateStringValue(const char* value,
                                         size_t length) {
  // Avoid an integer overflow in the call to malloc below by limiting length
  // to a sane value.
  if (length >= (size_t)Value::maxInt)
    length = Value::maxInt - 1;

  char* newString = static_cast<char*>(malloc(length + 1));
  if (newString == NULL) {
    throwRuntimeError(
        "in Json::Value::duplicateStringValue(): "
        "Failed to allocate string value buffer");
  }
  memcpy(newString, value, length);
  newString[length] = 0;
  return newString;
}